

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall
chrono::ChBody::ChBody
          (ChBody *this,void **vtt,
          shared_ptr<chrono::collision::ChCollisionModel> *new_collision_model)

{
  byte *pbVar1;
  ChLoadableUVW CVar2;
  _func_int **pp_Var3;
  element_type *peVar4;
  undefined1 auVar5 [64];
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_50 [24];
  double local_38;
  
  ChObj::ChObj((ChObj *)this);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChPhysicsItem_00b35bb8;
  (this->super_ChPhysicsItem).system = (ChSystem *)0x0;
  (this->super_ChPhysicsItem).vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChPhysicsItem).vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChPhysicsItem).cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_ChPhysicsItem).offset_w = 0;
  (this->super_ChPhysicsItem).offset_L = 0;
  local_58 = 0.0;
  local_68 = ZEXT416(0) << 0x40;
  local_50._0_8_ = 1.0;
  local_38 = 0.0;
  local_50._8_16_ = local_68;
  ChFrameMoving<double>::ChFrameMoving
            (&(this->super_ChBodyFrame).super_ChFrameMoving<double>,(ChVector<double> *)local_68,
             (ChQuaternion<double> *)local_50);
  (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChFrame_00b2bbf8;
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChContactable_1vars<6>).super_ChContactable._vptr_ChContactable =
       (_func_int **)&PTR__ChContactable_1vars_00b2c428;
  (this->super_ChContactable_1vars<6>).super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)&PTR__ChContactable_1vars_00b2c4d0;
  CVar2 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar2;
  *(void **)((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&this->gyro + -4) + 2) +
            *(long *)((long)CVar2 + -0x78)) = vtt[2];
  pp_Var3 = (_func_int **)*vtt;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = pp_Var3;
  (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)0xb2bfb0;
  (this->super_ChContactable_1vars<6>).super_ChContactable._vptr_ChContactable =
       (_func_int **)0xb2c048;
  (this->super_ChContactable_1vars<6>).super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var3[-3] +
            (long)(&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                    coord.pos + -6) + 0x10) = vtt[4];
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar5 = ZEXT464(0) << 0x40;
  this->marklist =
       (vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
        )auVar5._0_24_;
  this->forcelist =
       (vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
       )auVar5._24_24_;
  (this->gyro).m_data[0] = (double)auVar5._48_8_;
  (this->gyro).m_data[1] = (double)auVar5._56_8_;
  *(undefined1 (*) [64])((this->gyro).m_data + 2) = auVar5;
  *(undefined1 (*) [64])((this->Xtorque).m_data + 1) = auVar5;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(&this->marklist);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::clear(&this->forcelist);
  this->bflags = 0;
  if (this != (ChBody *)GetLog::static_cout_logger.super_ChLog.super_ChStreamOutAscii.number_format)
  {
    (this->Xforce).m_data[0] = VNULL;
    (this->Xforce).m_data[1] = DAT_00b90ac0;
    (this->Xforce).m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChBody *)&std::__ioinit) {
    (this->Xtorque).m_data[0] = VNULL;
    (this->Xtorque).m_data[1] = DAT_00b90ac0;
    (this->Xtorque).m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChBody *)&yylineno) {
    (this->Force_acc).m_data[0] = VNULL;
    (this->Force_acc).m_data[1] = DAT_00b90ac0;
    (this->Force_acc).m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChBody *)&utils::ChProfileManager::CurrentNode) {
    (this->Torque_acc).m_data[0] = VNULL;
    (this->Torque_acc).m_data[1] = DAT_00b90ac0;
    (this->Torque_acc).m_data[2] = DAT_00b90ac8;
  }
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (new_collision_model->
       super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(new_collision_model->
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  peVar4 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar4->_vptr_ChCollisionModel[0x16])(peVar4,&this->super_ChContactable_1vars<6>);
  this->density = 1000.0;
  this->max_speed = 0.5;
  this->max_wvel = 6.2831855;
  this->sleep_time = 0.6;
  this->sleep_starttime = 0.0;
  this->sleep_minspeed = 0.1;
  this->sleep_minwvel = 0.04;
  pbVar1 = (byte *)((long)&this->bflags + 1);
  *pbVar1 = *pbVar1 | 4;
  (this->variables).super_ChVariablesBody.user_data = this;
  this->body_id = 0;
  return;
}

Assistant:

ChBody::ChBody(std::shared_ptr<collision::ChCollisionModel> new_collision_model) {
    marklist.clear();
    forcelist.clear();

    BFlagsSetAllOFF();  // no flags

    Xforce = VNULL;
    Xtorque = VNULL;

    Force_acc = VNULL;
    Torque_acc = VNULL;

    collision_model = new_collision_model;
    collision_model->SetContactable(this);

    density = 1000.0f;

    max_speed = 0.5f;
    max_wvel = 2.0f * float(CH_C_PI);

    sleep_time = 0.6f;
    sleep_starttime = 0;
    sleep_minspeed = 0.1f;
    sleep_minwvel = 0.04f;
    SetUseSleeping(true);

    variables.SetUserData((void*)this);

    body_id = 0;
}